

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::emplace<OrderedScreen>
          (QGenericArrayOps<OrderedScreen> *this,qsizetype i,OrderedScreen *args)

{
  OrderedScreen **ppOVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_180;
  OrderedScreen tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<OrderedScreen>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<OrderedScreen>).size == i) {
      qVar5 = QArrayDataPointer<OrderedScreen>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<OrderedScreen>);
      if (qVar5 == 0) goto LAB_00113f58;
      OrderedScreen::OrderedScreen
                ((this->super_QArrayDataPointer<OrderedScreen>).ptr +
                 (this->super_QArrayDataPointer<OrderedScreen>).size,args);
LAB_0011407c:
      pqVar2 = &(this->super_QArrayDataPointer<OrderedScreen>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0011402e;
    }
LAB_00113f58:
    if (i == 0) {
      qVar5 = QArrayDataPointer<OrderedScreen>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<OrderedScreen>);
      if (qVar5 != 0) {
        OrderedScreen::OrderedScreen((this->super_QArrayDataPointer<OrderedScreen>).ptr + -1,args);
        ppOVar1 = &(this->super_QArrayDataPointer<OrderedScreen>).ptr;
        *ppOVar1 = *ppOVar1 + -1;
        goto LAB_0011407c;
      }
    }
  }
  memcpy(&tmp,&DAT_0011a320,0x100);
  OrderedScreen::OrderedScreen(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<OrderedScreen>).size != 0;
  QArrayDataPointer<OrderedScreen>::detachAndGrow
            (&this->super_QArrayDataPointer<OrderedScreen>,(uint)(i == 0 && bVar6),1,
             (OrderedScreen **)0x0,(QArrayDataPointer<OrderedScreen> *)0x0);
  if (i == 0 && bVar6) {
    OrderedScreen::OrderedScreen((this->super_QArrayDataPointer<OrderedScreen>).ptr + -1,&tmp);
    ppOVar1 = &(this->super_QArrayDataPointer<OrderedScreen>).ptr;
    *ppOVar1 = *ppOVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<OrderedScreen>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_180.sourceCopyConstruct = 0;
    local_180.nSource = 0;
    local_180.move = 0;
    local_180.sourceCopyAssign = 0;
    local_180.end = (OrderedScreen *)0x0;
    local_180.last = (OrderedScreen *)0x0;
    local_180.where = (OrderedScreen *)0x0;
    local_180.begin = (this->super_QArrayDataPointer<OrderedScreen>).ptr;
    local_180.size = (this->super_QArrayDataPointer<OrderedScreen>).size;
    local_180.data = &this->super_QArrayDataPointer<OrderedScreen>;
    Inserter::insertOne(&local_180,i,&tmp);
    (local_180.data)->ptr = local_180.begin;
    (local_180.data)->size = local_180.size;
  }
  QKmsOutput::~QKmsOutput(&tmp.vinfo.output);
LAB_0011402e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }